

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  application_specific_pool *this_00;
  undefined8 *puVar1;
  _data *this_01;
  int extraout_EAX;
  _data *p_Var2;
  cppcms_error *pcVar3;
  allocator local_81;
  unique_lock<std::recursive_mutex> lock;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> local_70;
  attachment local_60;
  
  if ((short)__fstype < 0) {
    pcVar3 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_60,"Direct specification of cppcms::app::legacy flag is forbidden",
               (allocator *)&lock);
    cppcms_error::cppcms_error(pcVar3,(string *)&local_60);
    __cxa_throw(pcVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  this_00 = *(application_specific_pool **)__special_file;
  ((this_00->d).ptr_)->size = (long)((this->d).ptr_)->thread_count;
  application_specific_pool::flags(this_00,(int)__fstype);
  if (((ulong)__fstype & 0x20) != 0) {
    puVar1 = *(undefined8 **)(*(long *)(*(long *)__special_file + 0x18) + 0x10);
    (**(code **)*puVar1)(puVar1,this->srv_);
  }
  std::unique_lock<std::recursive_mutex>::unique_lock(&lock,&((this->d).ptr_)->lock);
  this_01 = (this->d).ptr_;
  p_Var2 = this_01;
  do {
    p_Var2 = (_data *)(p_Var2->apps).
                      super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 == this_01) {
      std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,
                 (__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
                 __special_file);
      _data::attachment::attachment
                (&local_60,(shared_ptr<cppcms::application_specific_pool> *)&local_70,
                 (mount_point *)__dir);
      std::__cxx11::
      list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
      ::push_back(&this_01->apps,&local_60);
      _data::attachment::~attachment(&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
      return extraout_EAX;
    }
  } while ((p_Var2->lock).super___recursive_mutex_base._M_mutex.__align != *(long *)__special_file);
  pcVar3 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_60,"Attempt to mount application_specific_pool twice",&local_81);
  cppcms_error::cppcms_error(pcVar3,(string *)&local_60);
  __cxa_throw(pcVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void applications_pool::mount(booster::shared_ptr<application_specific_pool> gen,mount_point const &point,int flags)
{
	if(flags & app::legacy) {
		throw cppcms_error("Direct specification of cppcms::app::legacy flag is forbidden");
	}
	gen->size(d->thread_count);
	gen->flags(flags);
	if(flags & app::prepopulated)
		gen->prepopulate(*srv_);
	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	for(std::list<_data::attachment>::iterator it = d->apps.begin();it!=d->apps.end();++it) {
		if(it->pool == gen)
			throw cppcms_error("Attempt to mount application_specific_pool twice");
	}
	d->apps.push_back(_data::attachment(gen,point));
}